

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall google::protobuf::Message::CheckInitialized(Message *this)

{
  int iVar1;
  LogMessage *pLVar2;
  undefined4 extraout_var;
  LogFinisher local_69;
  string local_68;
  LogMessage local_48;
  
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[5])();
  if ((char)iVar1 == '\0') {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x9b);
    pLVar2 = internal::LogMessage::operator<<(&local_48,"CHECK failed: IsInitialized(): ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"Message of type \"");
    iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])(this);
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,(string *)(*(long *)(CONCAT44(extraout_var,iVar1) + 8) + 0x20));
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"\" is missing required fields: ");
    (*(this->super_MessageLite)._vptr_MessageLite[6])(&local_68,this);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,&local_68);
    internal::LogFinisher::operator=(&local_69,pLVar2);
    std::__cxx11::string::~string((string *)&local_68);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return;
}

Assistant:

void Message::CheckInitialized() const {
  GOOGLE_CHECK(IsInitialized()) << "Message of type \"" << GetDescriptor()->full_name()
                         << "\" is missing required fields: "
                         << InitializationErrorString();
}